

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

ICOReader * __thiscall ICOReader::iconAt(ICOReader *this,int index)

{
  QIODevice *pQVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  quint16_le qVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int in_EDX;
  Format FVar10;
  quint32_le qVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  ICOReader *this_00;
  uint uVar13;
  QSize QVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_130;
  QLatin1StringView local_118;
  QArrayDataPointer<char16_t> local_108;
  BMP_INFOHDR header;
  QArrayDataPointer<char16_t> local_b8;
  QLatin1StringView local_98;
  QArrayDataPointer<char> local_88;
  ICONDIRENTRY local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  this_00 = (ICOReader *)CONCAT44(in_register_00000034,index);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_58);
  iVar6 = count(this_00);
  if (in_EDX < iVar6) {
    local_68.bWidth = 0xaa;
    local_68.bHeight = 0xaa;
    local_68.bColorCount = 0xaa;
    local_68.bReserved = 0xaa;
    local_68.wPlanes.val = 0xaaaa;
    local_68.wBitCount.val = 0xaaaa;
    local_68.dwBytesInRes.val = 0xaaaaaaaa;
    local_68.dwImageOffset.val = 0xaaaaaaaa;
    bVar3 = readIconEntry(this_00,in_EDX,&local_68);
    if (bVar3) {
      cVar4 = (**(code **)(*(long *)this_00->iod + 0x88))(this_00->iod,local_68.dwImageOffset.val);
      if ((cVar4 != '\0') &&
         (uVar9 = local_68._8_8_ & 0xffffffff, lVar8 = (**(code **)(*(long *)this_00->iod + 0xa0))()
         , (long)uVar9 <= lVar8)) {
        local_88.size = -0x5555555555555556;
        local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_88.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QByteArray::fromRawData((QByteArray *)&local_88,(char *)iconAt::pngMagicData,8);
        QIODevice::read((longlong)&header);
        bVar3 = operator==((QByteArray *)&header,(QByteArray *)&local_88);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&header);
        if (bVar3) {
          (**(code **)(*(long *)this_00->iod + 0x88))(this_00->iod,local_68.dwImageOffset.val);
          (this->icoAttrib).nbits = -0x55555556;
          (this->icoAttrib).ncolors = -0x55555556;
          (this->icoAttrib).h = -0x55555556;
          (this->icoAttrib).w = -0x55555556;
          *(undefined8 *)&(this->icoAttrib).depth = 0xaaaaaaaaaaaaaaaa;
          QIODevice::read((longlong)&header);
          QImage::fromData((QImage *)this,(QByteArray *)&header,"png");
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&header);
          QLatin1String::QLatin1String(&local_98,"_q_icoOrigDepth");
          QString::QString((QString *)&header,local_98);
          QString::number((int)&local_b8,(uint)local_68.wBitCount.val);
          QImage::setText((QString *)this,(QString *)&header);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&header);
        }
        else {
          header.biClrUsed.val = 0xaaaaaaaa;
          header.biClrImportant.val = 0xaaaaaaaa;
          header.biCompression.val = 0xaaaaaaaa;
          header.biSizeImage.val = 0xaaaaaaaa;
          header.biXPelsPerMeter.val = 0xaaaaaaaa;
          header.biYPelsPerMeter.val = 0xaaaaaaaa;
          header.biSize.val = 0xaaaaaaaa;
          header.biWidth.val = 0xaaaaaaaa;
          header.biHeight.val = 0xaaaaaaaa;
          header.biPlanes.val = 0xaaaa;
          header.biBitCount.val = 0xaaaa;
          pQVar1 = this_00->iod;
          if ((((pQVar1 == (QIODevice *)0x0) ||
               (cVar4 = (**(code **)(*(long *)pQVar1 + 0x88))
                                  (pQVar1,(ulong)local_68.dwImageOffset.val + this_00->startpos),
               cVar4 == '\0')) || (this_00->iod == (QIODevice *)0x0)) ||
             (lVar8 = QIODevice::read((char *)this_00->iod,(longlong)&header), lVar8 != 0x28)) {
LAB_00104c9d:
            QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
            goto LAB_00104caa;
          }
          qVar5.val = header.biBitCount.val;
          if (header.biBitCount.val == 0) {
            qVar5.val = local_68.wBitCount.val;
          }
          uVar9 = (ulong)qVar5.val;
          (this_00->icoAttrib).nbits = (uint)qVar5.val;
          if (qVar5.val < 0x21) {
            if ((0x101010000U >> (uVar9 & 0x3f) & 1) == 0) {
              iVar6 = 1;
              if ((0x110UL >> (uVar9 & 0x3f) & 1) == 0) {
                if (uVar9 != 1) goto LAB_00104a70;
                bVar2 = 1;
              }
              else {
                iVar6 = 8;
                bVar2 = 0;
              }
              (this_00->icoAttrib).depth = iVar6;
              qVar11.val = 1 << ((byte)qVar5.val & 0x1f);
              if (header.biClrUsed.val == 0) goto LAB_00104a0f;
              (this_00->icoAttrib).ncolors = header.biClrUsed.val;
              qVar11.val = header.biClrUsed.val;
              if (0x100 < (int)header.biClrUsed.val) goto LAB_00104a70;
            }
            else {
              (this_00->icoAttrib).depth = 0x20;
              bVar2 = 0;
              qVar11.val = 0;
LAB_00104a0f:
              (this_00->icoAttrib).ncolors = qVar11.val;
            }
            uVar12 = (uint)local_68.bWidth;
            (this_00->icoAttrib).w = uVar12;
            if (uVar12 == 0) {
              (this_00->icoAttrib).w = header.biWidth.val;
            }
            uVar13 = (uint)local_68.bHeight;
            (this_00->icoAttrib).h = uVar13;
            if (uVar13 == 0) {
              (this_00->icoAttrib).h = header.biHeight.val >> 1;
            }
            if ((uVar12 != 0 || (int)header.biWidth.val < 0x101) &&
                (uVar13 != 0 || header.biHeight.val < 0x202)) {
              if (qVar5.val == 0x18) {
                FVar10 = Format_RGB32;
              }
              else if ((bool)(bVar2 & qVar11.val == 2)) {
                FVar10 = Format_Mono;
              }
              else {
                FVar10 = (uint)((int)qVar11.val < 1) * 2 + Format_Indexed8;
              }
              local_b8.size = -0x5555555555555556;
              local_b8.d._0_4_ = 0xaaaaaaaa;
              local_b8.d._4_4_ = 0xaaaaaaaa;
              local_b8.ptr._0_4_ = 0xaaaaaaaa;
              local_b8.ptr._4_4_ = 0xaaaaaaaa;
              QImage::QImage((QImage *)&local_b8);
              QVar14.ht.m_i = (this_00->icoAttrib).h;
              QVar14.wd.m_i = (this_00->icoAttrib).w;
              cVar4 = QImageIOHandler::allocateImage(QVar14,FVar10,(QImage *)&local_b8);
              if (cVar4 != '\0') {
                findColorInfo(this_00,(QImage *)&local_b8);
                cVar4 = QImage::isNull();
                if (cVar4 == '\0') {
                  readBMP(this_00,(QImage *)&local_b8);
                  cVar4 = QImage::isNull();
                  if (cVar4 == '\0') {
                    if ((this_00->icoAttrib).nbits == 0x20) {
                      QImage::convertToFormat
                                ((QImage *)&local_108,(Format)&local_b8,(ImageConversionFlags)0x6);
                      QImage::operator=((QImage *)&local_58,(QImage *)&local_108);
                    }
                    else {
                      local_108.size = -0x5555555555555556;
                      local_108.d = (Data *)0xaaaaaaaaaaaaaaaa;
                      local_108.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                      iVar6 = QImage::width();
                      iVar7 = QImage::height();
                      QImage::QImage((QImage *)&local_108,iVar6,iVar7,Format_Mono);
                      cVar4 = QImage::isNull();
                      if (cVar4 == '\0') {
                        iVar6 = (int)&local_108;
                        QImage::setColorCount(iVar6);
                        QImage::setColor(iVar6,0);
                        QImage::setColor(iVar6,1);
                        read1BitBMP(this_00,(QImage *)&local_108);
                        cVar4 = QImage::isNull();
                        if (cVar4 == '\0') {
                          QImage::operator=((QImage *)&local_58,(QImage *)&local_b8);
                          QImage::setAlphaChannel((QImage *)&local_58);
                        }
                      }
                    }
                    QImage::~QImage((QImage *)&local_108);
                  }
                }
              }
              QLatin1String::QLatin1String(&local_118,"_q_icoOrigDepth");
              QString::QString((QString *)&local_108,local_118);
              QString::number((int)&local_130,(uint)local_68.wBitCount.val);
              QImage::setText((QString *)&local_58,(QString *)&local_108);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
              QImage::~QImage((QImage *)&local_b8);
              goto LAB_00104c9d;
            }
          }
LAB_00104a70:
          QImage::QImage((QImage *)this,(QImage *)&local_58);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        goto LAB_00104cba;
      }
    }
  }
LAB_00104caa:
  QImage::QImage((QImage *)this,(QImage *)&local_58);
LAB_00104cba:
  QImage::~QImage((QImage *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QImage ICOReader::iconAt(int index)
{
    QImage img;

    if (count() > index) { // forces header to be read

        ICONDIRENTRY iconEntry;
        if (readIconEntry(index, &iconEntry)) {

            static const uchar pngMagicData[] = { 137, 80, 78, 71, 13, 10, 26, 10 };

            if (!iod->seek(iconEntry.dwImageOffset)
                || iconEntry.dwBytesInRes > iod->bytesAvailable())
                return img;

            const QByteArray pngMagic = QByteArray::fromRawData((const char*)pngMagicData, sizeof(pngMagicData));
            const bool isPngImage = (iod->read(pngMagic.size()) == pngMagic);

            if (isPngImage) {
                iod->seek(iconEntry.dwImageOffset);
                QImage image = QImage::fromData(iod->read(iconEntry.dwBytesInRes), "png");
                image.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
                return image;
            }

            BMP_INFOHDR header;
            if (readBMPHeader(iconEntry.dwImageOffset, &header)) {
                icoAttrib.nbits = header.biBitCount ? header.biBitCount : iconEntry.wBitCount;

                switch (icoAttrib.nbits) {
                case 32:
                case 24:
                case 16:
                    icoAttrib.depth = 32;
                    break;
                case 8:
                case 4:
                    icoAttrib.depth = 8;
                    break;
                case 1:
                    icoAttrib.depth = 1;
                    break;
                default:
                    return img;
                    break;
                }
                if (icoAttrib.depth == 32)                // there's no colormap
                    icoAttrib.ncolors = 0;
                else                    // # colors used
                    icoAttrib.ncolors = header.biClrUsed ? uint(header.biClrUsed) : 1 << icoAttrib.nbits;
                if (icoAttrib.ncolors > 256) //color table can't be more than 256
                    return img;
                icoAttrib.w = iconEntry.bWidth;
                if (icoAttrib.w == 0) // means 256 pixels
                    icoAttrib.w = header.biWidth;
                icoAttrib.h = iconEntry.bHeight;
                if (icoAttrib.h == 0) // means 256 pixels
                    icoAttrib.h = header.biHeight/2;
                if (icoAttrib.w > 256 || icoAttrib.h > 256) // Max ico size
                    return img;

                QImage::Format format = QImage::Format_ARGB32;
                if (icoAttrib.nbits == 24)
                    format = QImage::Format_RGB32;
                else if (icoAttrib.ncolors == 2 && icoAttrib.depth == 1)
                    format = QImage::Format_Mono;
                else if (icoAttrib.ncolors > 0)
                    format = QImage::Format_Indexed8;

                QImage image;
                const QSize size(icoAttrib.w, icoAttrib.h);
                if (QImageIOHandler::allocateImage(size, format, &image)) {
                    findColorInfo(image);
                    if (!image.isNull()) {
                        readBMP(image);
                        if (!image.isNull()) {
                            if (icoAttrib.nbits == 32) {
                                img = std::move(image).convertToFormat(QImage::Format_ARGB32_Premultiplied);
                            } else {
                                QImage mask(image.width(), image.height(), QImage::Format_Mono);
                                if (!mask.isNull()) {
                                    mask.setColorCount(2);
                                    mask.setColor(0, qRgba(255,255,255,0xff));
                                    mask.setColor(1, qRgba(0  ,0  ,0  ,0xff));
                                    read1BitBMP(mask);
                                    if (!mask.isNull()) {
                                        img = image;
                                        img.setAlphaChannel(mask);
                                    }
                                }
                            }
                        }
                    }
                }
                img.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
            }
        }
    }

    return img;
}